

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHandlerCSV.cpp
# Opt level: O3

void __thiscall
DataHandlerCSV::DataHandlerCSV(DataHandlerCSV *this,string *pathToFiles,char delimiter)

{
  string *__lhs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  pointer pcVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  iterator iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  unsigned_long uVar6;
  char cVar7;
  int iVar8;
  istream *piVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  const_iterator cVar14;
  mapped_type *pmVar15;
  Database *ppTVar16;
  long *plVar17;
  size_type *psVar18;
  long lVar19;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar20;
  ulong uVar21;
  ulong uVar22;
  uint_fast16_t attributeID;
  string line;
  string attrName;
  string tableName;
  stringstream ssLine;
  ifstream input;
  unsigned_long local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  long local_408;
  key_type local_400;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  (this->super_DataHandler)._vptr_DataHandler = (_func_int **)&PTR__DataHandler_00143b50;
  __lhs = &(this->super_DataHandler)._pathToFiles;
  (this->super_DataHandler)._pathToFiles._M_dataplus._M_p =
       (pointer)&(this->super_DataHandler)._pathToFiles.field_2;
  pcVar1 = (pathToFiles->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__lhs,pcVar1,pcVar1 + pathToFiles->_M_string_length);
  (this->super_DataHandler)._delimiter = delimiter;
  (this->super_DataHandler)._namesMapping._M_h._M_buckets =
       &(this->super_DataHandler)._namesMapping._M_h._M_single_bucket;
  (this->super_DataHandler)._namesMapping._M_h._M_bucket_count = 1;
  (this->super_DataHandler)._namesMapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_DataHandler)._namesMapping._M_h._M_element_count = 0;
  (this->super_DataHandler)._namesMapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_DataHandler)._namesMapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_DataHandler)._namesMapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_DataHandler)._vptr_DataHandler = (_func_int **)&PTR__DataHandlerCSV_00143ac8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0,
                 __lhs,&SCHEMA_CONF_abi_cxx11_);
  std::ifstream::ifstream((istream *)local_238,(string *)local_3c0,_S_in);
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_);
  }
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    local_428._M_string_length = 0;
    local_428.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    this_00 = &(this->super_DataHandler)._namesMapping;
    lVar19 = 0;
    uVar21 = 0;
    while( true ) {
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_428,cVar7);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      if (*local_428._M_dataplus._M_p != '#') {
        iVar8 = std::__cxx11::string::compare((char *)&local_428);
        if (iVar8 != 0) {
          uVar21 = uVar21 + 1;
          lVar19 = lVar19 + 0x20;
        }
      }
    }
    dfdb::params::NUM_OF_TABLES = uVar21;
    puVar10 = (ulong *)operator_new__(-(ulong)(uVar21 >> 0x3b != 0) | uVar21 << 5 | 8);
    *puVar10 = uVar21;
    if (uVar21 != 0) {
      puVar11 = puVar10 + 3;
      do {
        puVar11[-2] = (ulong)puVar11;
        puVar11[-1] = 0;
        *(undefined1 *)puVar11 = 0;
        puVar11 = puVar11 + 4;
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != 0);
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar21;
    uVar12 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar13 = uVar12 + 8;
    if (0xfffffffffffffff7 < uVar12) {
      uVar13 = 0xffffffffffffffff;
    }
    (this->super_DataHandler)._tableNames = (string *)(puVar10 + 1);
    uVar12 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar12 = uVar13;
    }
    puVar10 = (ulong *)operator_new__(uVar12);
    *puVar10 = uVar21;
    if (uVar21 != 0) {
      memset((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar10 + 1),0,
             ((uVar21 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    (this->super_DataHandler)._attrIDs =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(puVar10 + 1);
    std::ios::clear((int)(istream *)local_238 + (int)*(undefined8 *)(local_238[0] + -0x18));
    std::istream::seekg((long)local_238,_S_beg);
    local_430 = 0;
    local_408 = 0;
    while( true ) {
      cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_428,cVar7);
      uVar21 = dfdb::params::NUM_OF_WORKERS;
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      if (*local_428._M_dataplus._M_p != '#') {
        iVar8 = std::__cxx11::string::compare((char *)&local_428);
        if (iVar8 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_3c0 + 0x10),local_428._M_dataplus._M_p,
                     local_428._M_string_length);
          local_3d8 = 0;
          local_3d0[0] = 0;
          local_3e0 = local_3d0;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_3c0,(string *)&local_3e0,':');
          lVar19 = local_408;
          std::__cxx11::string::_M_assign
                    ((string *)((this->super_DataHandler)._tableNames + local_408));
          local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
          local_400._M_string_length = 0;
          local_400.field_2._M_local_buf[0] = '\0';
          while( true ) {
            piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)local_3c0,(string *)&local_400,',');
            if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
            cVar14 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this_00->_M_h,&local_400);
            uVar6 = local_430;
            if (cVar14.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              pmVar15 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)this_00,&local_400);
              *pmVar15 = uVar6;
              pvVar20 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        ((this->super_DataHandler)._attrIDs + lVar19);
              iVar3._M_current = *(unsigned_long **)(pvVar20 + 8);
              if (iVar3._M_current == *(unsigned_long **)(pvVar20 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(pvVar20,iVar3,&local_430);
              }
              else {
                *iVar3._M_current = local_430;
                *(unsigned_long **)(pvVar20 + 8) = iVar3._M_current + 1;
              }
              local_430 = local_430 + 1;
            }
            else {
              pvVar2 = (this->super_DataHandler)._attrIDs;
              pmVar15 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)this_00,&local_400);
              pvVar20 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar2 + lVar19);
              iVar3._M_current = *(unsigned_long **)(pvVar20 + 8);
              if (iVar3._M_current == *(unsigned_long **)(pvVar20 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(pvVar20,iVar3,pmVar15);
              }
              else {
                *iVar3._M_current = *pmVar15;
                *(unsigned_long **)(pvVar20 + 8) = iVar3._M_current + 1;
              }
            }
          }
          std::ios::clear((int)*(undefined8 *)(local_3c0._0_8_ + -0x18) + (int)local_3c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          if (local_3e0 != local_3d0) {
            operator_delete(local_3e0);
          }
          local_408 = local_408 + 1;
        }
      }
    }
    ppTVar16 = (Database *)
               operator_new__(-(ulong)(dfdb::params::NUM_OF_WORKERS >> 0x3d != 0) |
                              dfdb::params::NUM_OF_WORKERS * 8);
    (this->super_DataHandler)._receivedDataToProcess = ppTVar16;
    uVar12 = dfdb::params::NUM_OF_TABLES;
    if (uVar21 != 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dfdb::params::NUM_OF_TABLES;
      uVar13 = SUB168(auVar5 * ZEXT816(0x18),0);
      uVar22 = uVar13 + 8;
      if (0xfffffffffffffff7 < uVar13) {
        uVar22 = 0xffffffffffffffff;
      }
      if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      lVar19 = dfdb::params::NUM_OF_TABLES * 0x18;
      uVar13 = 0;
      do {
        puVar10 = (ulong *)operator_new__(uVar22);
        *puVar10 = uVar12;
        if (uVar12 != 0) {
          memset((Database)(puVar10 + 1),0,((lVar19 - 0x18U) / 0x18) * 0x18 + 0x18);
        }
        (this->super_DataHandler)._receivedDataToProcess[uVar13] = (Database)(puVar10 + 1);
        uVar13 = uVar13 + 1;
      } while (uVar21 != uVar13);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::operator+(&local_428,__lhs,&SCHEMA_CONF_abi_cxx11_);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_428);
  local_3c0._0_8_ = *plVar17;
  psVar18 = (size_type *)(plVar17 + 2);
  if ((size_type *)local_3c0._0_8_ == psVar18) {
    local_3b0[0]._0_8_ = *psVar18;
    local_3b0[0]._8_8_ = plVar17[3];
    local_3c0._0_8_ = local_3c0 + 0x10;
  }
  else {
    local_3b0[0]._0_8_ = *psVar18;
  }
  local_3c0._8_8_ = plVar17[1];
  *plVar17 = (long)psVar18;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  std::operator<<((ostream *)&std::cerr,(string *)local_3c0);
  std::__cxx11::string::~string((string *)local_3c0);
  std::__cxx11::string::~string((string *)&local_428);
  exit(1);
}

Assistant:

DataHandlerCSV::DataHandlerCSV(const string& pathToFiles, const char delimiter) :
		DataHandler(pathToFiles, delimiter)
{
	/* Load the database schema file into an input stream. */
	ifstream input(_pathToFiles + SCHEMA_CONF);
    
    if (!input)
    {
        ERROR (_pathToFiles + SCHEMA_CONF + " does is not exist. \n");
        exit(1);
    }
    
	/* String and associated stream to receive lines from the file. */
	string line;
	stringstream ssLine;

	size_t numOfTables = 0;

	/* Count the number of tables in the database. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;
		++numOfTables;
	}

	/* Check consistency between compile time flag and runtime value issued from configuration file. */
#ifdef TABLES
	if(TABLES != numOfTables)
	{
		ERROR("Value of compiler flag -DTABLES and number of tables specified in schema.conf inconsistent. Aborting.\n")
		exit(1);
	}
	/* Assign value to extern variable in GlobalParams.hpp. */
#else
	NUM_OF_TABLES = numOfTables;
#endif

	/* Initialise arrays; each element will correspond to one database table. */
	_tableNames = new string[NUM_OF_TABLES];
	_attrIDs = new vector<uint_fast16_t> [NUM_OF_TABLES];

	/* Reset input stream to beginning of file. */
	input.clear();
	input.seekg(0, ios::beg);

	/* Variable defining the ID of each attribute. */
	uint_fast16_t attributeID = 0;

	size_t table = 0;
	/* Scan through the input stream line by line. */
	while (getline(input, line))
	{
		if (line[0] == COMMENT_CHAR || line == "")
			continue;

		ssLine << line;

		string tableName;
		/* Extract the name of the table in the current line. */
		getline(ssLine, tableName, TABLE_NAME_CHAR);
		_tableNames[table] = tableName;

		string attrName;
		/* Scan through the attributes in the current line. */
		while (getline(ssLine, attrName, ATTRIBUTE_SEPARATOR_CHAR))
		{
			/* Attribute encountered for the first time in the schema: give it a new ID. */
			if (_namesMapping.count(attrName) == 0)
			{
				_namesMapping[attrName] = attributeID;
				_attrIDs[table].push_back(attributeID);
				++attributeID;
			}
			/* Attribute already encountered: just add its ID to the vector of IDs for the current table. */
			else
			{
				_attrIDs[table].push_back(_namesMapping[attrName]);
			}
		}
		++table;
		/* Clear string stream. */
		ssLine.clear();
	}
	assert(
			table == NUM_OF_TABLES
					&& "The same number of lines must be processed during the first and the second pass over the schema file.");

	/* Initialise array; each element will correspond to one orker in the network. */
	_receivedDataToProcess = new Database[NUM_OF_WORKERS];
	for (size_t worker = 0; worker < NUM_OF_WORKERS; ++worker)
	{
		_receivedDataToProcess[worker] = new Table[NUM_OF_TABLES];
	}
}